

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_type.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::pixie::FieldTypeMethods::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FieldTypeMethods *this,FieldTypeEnum field_type)

{
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [19];
  allocator<char> local_12;
  char local_11;
  string *psStack_10;
  FieldTypeEnum field_type_local;
  
  local_11 = (char)this;
  psStack_10 = __return_storage_ptr__;
  if (local_11 == ' ') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DISCARD",&local_28);
    std::allocator<char>::~allocator(&local_28);
  }
  else if (local_11 == 'D') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DOUBLE",&local_12);
    std::allocator<char>::~allocator(&local_12);
  }
  else if (local_11 == 'I') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INTEGER",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else if (local_11 == 'L') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"LONG",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  else if (local_11 == 'S') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"STRING",&local_27);
    std::allocator<char>::~allocator(&local_27);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DOUBLE",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldTypeMethods::ToString(FieldTypeEnum field_type)
{
    switch (field_type)
    {
        case FieldTypeEnum::DOUBLE:
            return "DOUBLE";
        case FieldTypeEnum::INTEGER:
            return "INTEGER";
        case FieldTypeEnum::LONG:
            return "LONG";
        case FieldTypeEnum::STRING:
            return "STRING";
        case FieldTypeEnum::DISCARD:
            return "DISCARD";
        default:
            return "DOUBLE";
    }
}